

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckFeatures.cpp
# Opt level: O2

bool __thiscall GrcManager::PreCompileLanguages(GrcManager *this,GrcFont *param_1)

{
  pointer ppGVar1;
  size_t ilcls;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppGVar1 = (this->m_vplcls).super__Vector_base<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->m_vplcls).
                            super__Vector_base<GdlLangClass_*,_std::allocator<GdlLangClass_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3);
      uVar2 = uVar2 + 1) {
    GdlLangClass::PreCompile(ppGVar1[uVar2],this);
  }
  GdlRenderer::CheckLanguageFeatureSize(this->m_prndr);
  return true;
}

Assistant:

bool GrcManager::PreCompileLanguages(GrcFont * /*pfont*/)
{
	for (size_t ilcls = 0; ilcls < m_vplcls.size(); ilcls++)
		m_vplcls[ilcls]->PreCompile(this);

	m_prndr->CheckLanguageFeatureSize();

	return true;
}